

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O1

void __thiscall
senjo::MoveFinder::AddKnightMoves
          (MoveFinder *this,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins,
          int x,int y,char cap,list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *moves)

{
  Square SVar1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  Square dest;
  ChessMove move;
  Square local_60;
  int local_5c;
  int local_58;
  ChessMove local_54;
  MoveFinder *local_48;
  list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *local_40;
  int local_34;
  
  local_54.from.sqr = 0x78;
  local_54.to.sqr = 0x78;
  local_54.cap = '\0';
  local_54.promo = '\0';
  local_60.sqr = 0x78;
  p_Var3 = (origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(origins->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    _Var2 = y * 0x10 + x;
    if (7 < (uint)(y | x)) {
      _Var2 = 0x78;
    }
    local_34 = _Var2 + 0x77;
    local_58 = (int)cap;
    local_5c = y;
    local_48 = this;
    local_40 = moves;
    do {
      SVar1.sqr = p_Var3[1]._M_color;
      local_54.from.sqr = SVar1.sqr;
      iVar4 = 0;
      if (((SVar1.sqr | _Var2) & 0xffffff88) == _S_red) {
        iVar4 = *(int *)(Square::DirectionTo(senjo::Square_const&)::DIRECTION +
                        (ulong)(uint)(local_34 - SVar1.sqr) * 4);
      }
      if (iVar4 < 0) {
        if (iVar4 < -0x12) {
          if (iVar4 == -0x21) goto LAB_0013d246;
          if (iVar4 != -0x1f) goto LAB_0013d486;
          goto LAB_0013d16c;
        }
        if (iVar4 == -0x12) goto LAB_0013d2ad;
        if (iVar4 != -0xe) goto LAB_0013d486;
LAB_0013d1e9:
        local_60.sqr = local_54.from.sqr - 0xe;
        if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
          local_60.sqr = 0x78;
        }
        if ((local_60.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
        }
        if (iVar4 < 0x12) {
          if (iVar4 != 0) {
LAB_0013d30a:
            if (iVar4 != 0xe) goto LAB_0013d486;
          }
LAB_0013d32d:
          local_60.sqr = local_54.from.sqr + 0xe;
          if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
            local_60.sqr = 0x78;
          }
          if ((local_60.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
          }
          if (0x1e < iVar4) goto LAB_0013d3e0;
          if (iVar4 != 0) {
LAB_0013d37d:
            if (iVar4 != 0x12) goto LAB_0013d486;
          }
LAB_0013d386:
          local_60.sqr = local_54.from.sqr + 0x12;
          if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
            local_60.sqr = 0x78;
          }
          if ((local_60.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
          }
          if (iVar4 != 0) {
            if (iVar4 != 0x21) {
              if (iVar4 != 0x1f) goto LAB_0013d486;
              goto LAB_0013d3ef;
            }
            goto LAB_0013d43f;
          }
LAB_0013d3ef:
          local_60.sqr = local_54.from.sqr + 0x1f;
          if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
            local_60.sqr = 0x78;
          }
          if ((local_60.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
          }
          if ((iVar4 != 0x21) && (iVar4 != 0)) goto LAB_0013d486;
        }
        else {
LAB_0013d314:
          if (iVar4 == 0x12) goto LAB_0013d386;
LAB_0013d3e0:
          if (iVar4 == 0x1f) goto LAB_0013d3ef;
          if (iVar4 != 0x21) goto LAB_0013d486;
        }
LAB_0013d43f:
        local_60.sqr = local_54.from.sqr + 0x21;
        if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
          local_60.sqr = 0x78;
        }
        if ((local_60.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
        }
      }
      else {
        if (0x11 < iVar4) goto LAB_0013d314;
        if (iVar4 != 0) goto LAB_0013d30a;
LAB_0013d246:
        local_60.sqr = SVar1.sqr - 0x21;
        if (((SVar1.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
          local_60.sqr = 0x78;
        }
        if ((local_60.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
        }
        if (0xd < iVar4) {
LAB_0013d31f:
          if (iVar4 < 0x1f) {
            if (iVar4 == 0xe) goto LAB_0013d32d;
            goto LAB_0013d37d;
          }
          goto LAB_0013d3e0;
        }
        if (iVar4 < -0xe) {
          if (iVar4 == -0x1f) {
LAB_0013d16c:
            local_60.sqr = local_54.from.sqr - 0x1f;
            if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
              local_60.sqr = 0x78;
            }
            if ((local_60.sqr & 0xffffff88) == _S_red) {
              AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
            }
            if (iVar4 < 0xe) {
              if (iVar4 != -0x12) {
                if (iVar4 == -0xe) goto LAB_0013d1e9;
                if (iVar4 != 0) goto LAB_0013d486;
              }
LAB_0013d2ad:
              local_60.sqr = local_54.from.sqr - 0x12;
              if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
                local_60.sqr = 0x78;
              }
              if ((local_60.sqr & 0xffffff88) == _S_red) {
                AddMove(local_48,&local_54,&local_60,x,local_5c,(char)local_58,local_40);
              }
              if (0x11 < iVar4) goto LAB_0013d314;
              if ((iVar4 == -0xe) || (iVar4 == 0)) goto LAB_0013d1e9;
              goto LAB_0013d30a;
            }
            goto LAB_0013d31f;
          }
          if (iVar4 == -0x12) goto LAB_0013d2ad;
        }
        else {
          if (iVar4 == -0xe) goto LAB_0013d1e9;
          if (iVar4 == 0) goto LAB_0013d16c;
        }
      }
LAB_0013d486:
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return;
}

Assistant:

void MoveFinder::AddKnightMoves(const std::set<Square>& origins,
                                const int x, const int y, const char cap,
                                std::list<ChessMove>& moves) const
{
  ChessMove move;
  Direction direction;
  Square    dest;
  std::set<Square>::const_iterator it;
  for (it = origins.begin(); it != origins.end(); ++it) {
    move.from = *it;
    direction = move.from.DirectionTo(Square(x, y));
    if ((direction == Direction::Unknown) || (direction == KnightMove1)) {
      if ((dest = (move.from + KnightMove1)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove2)) {
      if ((dest = (move.from + KnightMove2)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove3)) {
      if ((dest = (move.from + KnightMove3)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove4)) {
      if ((dest = (move.from + KnightMove4)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove5)) {
      if ((dest = (move.from + KnightMove5)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove6)) {
      if ((dest = (move.from + KnightMove6)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove7)) {
      if ((dest = (move.from + KnightMove7)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove8)) {
      if ((dest = (move.from + KnightMove8)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
  }
}